

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_registry.cc
# Opt level: O0

void __thiscall test_typename_is_in_namespace::test_method(test_typename_is_in_namespace *this)

{
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  lazy_ostream *plVar4;
  basic_cstring<const_char> local_fc0;
  basic_cstring<const_char> local_fb0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_fa0;
  allocator local_f79;
  string local_f78 [39];
  allocator local_f51;
  string local_f50 [32];
  assertion_result local_f30;
  basic_cstring<const_char> local_f18;
  basic_cstring<const_char> local_f08;
  basic_cstring<const_char> local_ef8;
  basic_cstring<const_char> local_ee8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_ed8;
  allocator local_eb1;
  string local_eb0 [39];
  allocator local_e89;
  string local_e88 [32];
  assertion_result local_e68;
  basic_cstring<const_char> local_e50;
  basic_cstring<const_char> local_e40;
  basic_cstring<const_char> local_e30;
  basic_cstring<const_char> local_e20;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_e10;
  allocator local_de9;
  string local_de8 [39];
  allocator local_dc1;
  string local_dc0 [32];
  assertion_result local_da0;
  basic_cstring<const_char> local_d88;
  basic_cstring<const_char> local_d78;
  basic_cstring<const_char> local_d68;
  basic_cstring<const_char> local_d58;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_d48;
  allocator local_d21;
  string local_d20 [39];
  allocator local_cf9;
  string local_cf8 [32];
  assertion_result local_cd8;
  basic_cstring<const_char> local_cc0;
  basic_cstring<const_char> local_cb0;
  basic_cstring<const_char> local_ca0;
  basic_cstring<const_char> local_c90;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_c80;
  allocator local_c59;
  string local_c58 [39];
  allocator local_c31;
  string local_c30 [32];
  assertion_result local_c10;
  basic_cstring<const_char> local_bf8;
  basic_cstring<const_char> local_be8;
  basic_cstring<const_char> local_bd8;
  basic_cstring<const_char> local_bc8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_bb8;
  allocator local_b91;
  string local_b90 [39];
  allocator local_b69;
  string local_b68 [32];
  assertion_result local_b48;
  basic_cstring<const_char> local_b30;
  basic_cstring<const_char> local_b20;
  basic_cstring<const_char> local_b10;
  basic_cstring<const_char> local_b00;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_af0;
  allocator local_ac9;
  string local_ac8 [39];
  allocator local_aa1;
  string local_aa0 [32];
  assertion_result local_a80;
  basic_cstring<const_char> local_a68;
  basic_cstring<const_char> local_a58;
  basic_cstring<const_char> local_a48;
  basic_cstring<const_char> local_a38;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a28;
  allocator local_a01;
  string local_a00 [39];
  allocator local_9d9;
  string local_9d8 [32];
  assertion_result local_9b8;
  basic_cstring<const_char> local_9a0;
  basic_cstring<const_char> local_990;
  basic_cstring<const_char> local_980;
  basic_cstring<const_char> local_970;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_960;
  allocator local_939;
  string local_938 [39];
  allocator local_911;
  string local_910 [32];
  assertion_result local_8f0;
  basic_cstring<const_char> local_8d8;
  basic_cstring<const_char> local_8c8;
  basic_cstring<const_char> local_8b8;
  basic_cstring<const_char> local_8a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_898;
  allocator local_871;
  string local_870 [39];
  allocator local_849;
  string local_848 [32];
  assertion_result local_828;
  basic_cstring<const_char> local_810;
  basic_cstring<const_char> local_800;
  basic_cstring<const_char> local_7f0;
  basic_cstring<const_char> local_7e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_7d0;
  allocator local_7a9;
  string local_7a8 [39];
  allocator local_781;
  string local_780 [32];
  assertion_result local_760;
  basic_cstring<const_char> local_748;
  basic_cstring<const_char> local_738;
  basic_cstring<const_char> local_728;
  basic_cstring<const_char> local_718;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_708;
  allocator local_6e1;
  string local_6e0 [39];
  allocator local_6b9;
  string local_6b8 [32];
  assertion_result local_698;
  basic_cstring<const_char> local_680;
  basic_cstring<const_char> local_670;
  basic_cstring<const_char> local_660;
  basic_cstring<const_char> local_650;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_640;
  allocator local_619;
  string local_618 [39];
  allocator local_5f1;
  string local_5f0 [32];
  assertion_result local_5d0;
  basic_cstring<const_char> local_5b8;
  basic_cstring<const_char> local_5a8;
  basic_cstring<const_char> local_598;
  basic_cstring<const_char> local_588;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_578;
  allocator local_551;
  string local_550 [39];
  allocator local_529;
  string local_528 [32];
  assertion_result local_508;
  basic_cstring<const_char> local_4f0;
  basic_cstring<const_char> local_4e0;
  basic_cstring<const_char> local_4d0;
  basic_cstring<const_char> local_4c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4b0;
  allocator local_489;
  string local_488 [39];
  allocator local_461;
  string local_460 [32];
  assertion_result local_440;
  basic_cstring<const_char> local_428;
  basic_cstring<const_char> local_418;
  basic_cstring<const_char> local_408;
  basic_cstring<const_char> local_3f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3e8;
  allocator local_3c1;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [32];
  assertion_result local_378;
  basic_cstring<const_char> local_360;
  basic_cstring<const_char> local_350;
  basic_cstring<const_char> local_340;
  basic_cstring<const_char> local_330;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_320;
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  assertion_result local_2b0;
  basic_cstring<const_char> local_298;
  basic_cstring<const_char> local_288;
  basic_cstring<const_char> local_278;
  basic_cstring<const_char> local_268;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_258;
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [32];
  assertion_result local_1e8;
  basic_cstring<const_char> local_1d0;
  basic_cstring<const_char> local_1c0;
  basic_cstring<const_char> local_1b0;
  basic_cstring<const_char> local_1a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_190;
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  assertion_result local_120;
  basic_cstring<const_char> local_108;
  basic_cstring<const_char> local_f8;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_c8;
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  assertion_result local_48;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  test_typename_is_in_namespace *local_10;
  test_typename_is_in_namespace *this_local;
  
  local_10 = this;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_20,0x2a,&local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"/A/B/Type",&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"/A/C",&local_a1);
    bVar2 = Typelib::isInNamespace(local_68,local_a0,false);
    boost::test_tools::assertion_result::assertion_result(&local_48,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,"!isInNamespace(\"/A/B/Type\" , \"/A/C\" , false)",0x2c);
    boost::unit_test::operator<<(&local_c8,plVar4,&local_d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_48,&local_c8,&local_e8,0x2a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_c8);
    boost::test_tools::assertion_result::~assertion_result(&local_48);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_108);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f8,0x2b,&local_108);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"/A/B/Type",&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"/A/C/",&local_169);
    bVar2 = Typelib::isInNamespace(local_140,local_168,false);
    boost::test_tools::assertion_result::assertion_result(&local_120,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a0,"!isInNamespace(\"/A/B/Type\" , \"/A/C/\" , false)",0x2d);
    boost::unit_test::operator<<(&local_190,plVar4,&local_1a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_120,&local_190,&local_1b0,0x2b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_190);
    boost::test_tools::assertion_result::~assertion_result(&local_120);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1c0,0x2c,&local_1d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_208,"/B/B/Type",&local_209);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_230,"/B/A",&local_231);
    bVar2 = Typelib::isInNamespace(local_208,local_230,false);
    boost::test_tools::assertion_result::assertion_result(&local_1e8,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_268,"!isInNamespace(\"/B/B/Type\" , \"/B/A\" , false)",0x2c);
    boost::unit_test::operator<<(&local_258,plVar4,&local_268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_278,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_1e8,&local_258,&local_278,0x2c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_258);
    boost::test_tools::assertion_result::~assertion_result(&local_1e8);
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_288,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_298);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_288,0x2d,&local_298);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d0,"/B/B/Type",&local_2d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2f8,"/B/A/",&local_2f9);
    bVar2 = Typelib::isInNamespace(local_2d0,local_2f8,false);
    boost::test_tools::assertion_result::assertion_result(&local_2b0,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_330,"!isInNamespace(\"/B/B/Type\" , \"/B/A/\" , false)",0x2d);
    boost::unit_test::operator<<(&local_320,plVar4,&local_330);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_340,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_2b0,&local_320,&local_340,0x2d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_320);
    boost::test_tools::assertion_result::~assertion_result(&local_2b0);
    std::__cxx11::string::~string(local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
    std::__cxx11::string::~string(local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_350,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_360);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_350,0x2e,&local_360);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_398,"/A/B/Type",&local_399);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3c0,"/A/B/C",&local_3c1);
    bVar2 = Typelib::isInNamespace(local_398,local_3c0,false);
    boost::test_tools::assertion_result::assertion_result(&local_378,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3f8,"!isInNamespace(\"/A/B/Type\" , \"/A/B/C\" , false)",0x2e);
    boost::unit_test::operator<<(&local_3e8,plVar4,&local_3f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_408,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_378,&local_3e8,&local_408,0x2e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_3e8);
    boost::test_tools::assertion_result::~assertion_result(&local_378);
    std::__cxx11::string::~string(local_3c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
    std::__cxx11::string::~string(local_398);
    std::allocator<char>::~allocator((allocator<char> *)&local_399);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_418,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_428);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_418,0x2f,&local_428);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_460,"/A/B/Type",&local_461);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_488,"/A/B/C/",&local_489);
    bVar2 = Typelib::isInNamespace(local_460,local_488,false);
    boost::test_tools::assertion_result::assertion_result(&local_440,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4c0,"!isInNamespace(\"/A/B/Type\" , \"/A/B/C/\" , false)",0x2f);
    boost::unit_test::operator<<(&local_4b0,plVar4,&local_4c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4d0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_440,&local_4b0,&local_4d0,0x2f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4b0);
    boost::test_tools::assertion_result::~assertion_result(&local_440);
    std::__cxx11::string::~string(local_488);
    std::allocator<char>::~allocator((allocator<char> *)&local_489);
    std::__cxx11::string::~string(local_460);
    std::allocator<char>::~allocator((allocator<char> *)&local_461);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4e0,0x30,&local_4f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_528,"/A/B/Type",&local_529);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_550,"/A/C",&local_551);
    bVar2 = Typelib::isInNamespace(local_528,local_550,true);
    boost::test_tools::assertion_result::assertion_result(&local_508,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_588,"!isInNamespace(\"/A/B/Type\" , \"/A/C\" , true)",0x2b);
    boost::unit_test::operator<<(&local_578,plVar4,&local_588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_598,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_508,&local_578,&local_598,0x30,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_578);
    boost::test_tools::assertion_result::~assertion_result(&local_508);
    std::__cxx11::string::~string(local_550);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
    std::__cxx11::string::~string(local_528);
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5a8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5a8,0x31,&local_5b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5f0,"/A/B/Type",&local_5f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_618,"/A/C/",&local_619);
    bVar2 = Typelib::isInNamespace(local_5f0,local_618,true);
    boost::test_tools::assertion_result::assertion_result(&local_5d0,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_650,"!isInNamespace(\"/A/B/Type\" , \"/A/C/\" , true)",0x2c);
    boost::unit_test::operator<<(&local_640,plVar4,&local_650);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_660,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_5d0,&local_640,&local_660,0x31,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_640);
    boost::test_tools::assertion_result::~assertion_result(&local_5d0);
    std::__cxx11::string::~string(local_618);
    std::allocator<char>::~allocator((allocator<char> *)&local_619);
    std::__cxx11::string::~string(local_5f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_670,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_680);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_670,0x32,&local_680);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6b8,"/B/B/Type",&local_6b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6e0,"/B/A",&local_6e1);
    bVar2 = Typelib::isInNamespace(local_6b8,local_6e0,true);
    boost::test_tools::assertion_result::assertion_result(&local_698,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_718,"!isInNamespace(\"/B/B/Type\" , \"/B/A\" , true)",0x2b);
    boost::unit_test::operator<<(&local_708,plVar4,&local_718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_728,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_698,&local_708,&local_728,0x32,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_708);
    boost::test_tools::assertion_result::~assertion_result(&local_698);
    std::__cxx11::string::~string(local_6e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
    std::__cxx11::string::~string(local_6b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_738,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_748);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_738,0x33,&local_748);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_780,"/B/B/Type",&local_781);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7a8,"/B/A/",&local_7a9);
    bVar2 = Typelib::isInNamespace(local_780,local_7a8,true);
    boost::test_tools::assertion_result::assertion_result(&local_760,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7e0,"!isInNamespace(\"/B/B/Type\" , \"/B/A/\" , true)",0x2c);
    boost::unit_test::operator<<(&local_7d0,plVar4,&local_7e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7f0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_760,&local_7d0,&local_7f0,0x33,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_7d0);
    boost::test_tools::assertion_result::~assertion_result(&local_760);
    std::__cxx11::string::~string(local_7a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
    std::__cxx11::string::~string(local_780);
    std::allocator<char>::~allocator((allocator<char> *)&local_781);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_800,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_810);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_800,0x34,&local_810);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_848,"/A/B/Type",&local_849);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_870,"/A/B/C",&local_871);
    bVar2 = Typelib::isInNamespace(local_848,local_870,true);
    boost::test_tools::assertion_result::assertion_result(&local_828,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8a8,"!isInNamespace(\"/A/B/Type\" , \"/A/B/C\" , true)",0x2d);
    boost::unit_test::operator<<(&local_898,plVar4,&local_8a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_828,&local_898,&local_8b8,0x34,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_898);
    boost::test_tools::assertion_result::~assertion_result(&local_828);
    std::__cxx11::string::~string(local_870);
    std::allocator<char>::~allocator((allocator<char> *)&local_871);
    std::__cxx11::string::~string(local_848);
    std::allocator<char>::~allocator((allocator<char> *)&local_849);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8c8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_8d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_8c8,0x35,&local_8d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_910,"/A/B/Type",&local_911);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_938,"/A/B/C/",&local_939);
    bVar2 = Typelib::isInNamespace(local_910,local_938,true);
    boost::test_tools::assertion_result::assertion_result(&local_8f0,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_970,"!isInNamespace(\"/A/B/Type\" , \"/A/B/C/\" , true)",0x2e);
    boost::unit_test::operator<<(&local_960,plVar4,&local_970);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_980,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_8f0,&local_960,&local_980,0x35,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_960);
    boost::test_tools::assertion_result::~assertion_result(&local_8f0);
    std::__cxx11::string::~string(local_938);
    std::allocator<char>::~allocator((allocator<char> *)&local_939);
    std::__cxx11::string::~string(local_910);
    std::allocator<char>::~allocator((allocator<char> *)&local_911);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_990,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_9a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_990,0x37,&local_9a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_9d8,"/A/B/C/Type",&local_9d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a00,"/A/B",&local_a01);
    bVar2 = Typelib::isInNamespace(local_9d8,local_a00,false);
    boost::test_tools::assertion_result::assertion_result(&local_9b8,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a38,"!isInNamespace(\"/A/B/C/Type\" , \"/A/B\" , false)",0x2e);
    boost::unit_test::operator<<(&local_a28,plVar4,&local_a38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a48,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_9b8,&local_a28,&local_a48,0x37,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a28);
    boost::test_tools::assertion_result::~assertion_result(&local_9b8);
    std::__cxx11::string::~string(local_a00);
    std::allocator<char>::~allocator((allocator<char> *)&local_a01);
    std::__cxx11::string::~string(local_9d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a58,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a68);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a58,0x38,&local_a68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_aa0,"/A/B/C/Type",&local_aa1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ac8,"/A/B/",&local_ac9);
    bVar2 = Typelib::isInNamespace(local_aa0,local_ac8,false);
    boost::test_tools::assertion_result::assertion_result(&local_a80,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b00,"!isInNamespace(\"/A/B/C/Type\" , \"/A/B/\" , false)",0x2f);
    boost::unit_test::operator<<(&local_af0,plVar4,&local_b00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b10,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_a80,&local_af0,&local_b10,0x38,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_af0);
    boost::test_tools::assertion_result::~assertion_result(&local_a80);
    std::__cxx11::string::~string(local_ac8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
    std::__cxx11::string::~string(local_aa0);
    std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b20,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b20,0x39,&local_b30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b68,"/A/B/Type",&local_b69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b90,"/A/B",&local_b91);
    bVar2 = Typelib::isInNamespace(local_b68,local_b90,false);
    boost::test_tools::assertion_result::assertion_result(&local_b48,(bool)(bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bc8,"isInNamespace(\"/A/B/Type\" , \"/A/B\" , false)",0x2b);
    boost::unit_test::operator<<(&local_bb8,plVar4,&local_bc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bd8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_b48,&local_bb8,&local_bd8,0x39,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_bb8);
    boost::test_tools::assertion_result::~assertion_result(&local_b48);
    std::__cxx11::string::~string(local_b90);
    std::allocator<char>::~allocator((allocator<char> *)&local_b91);
    std::__cxx11::string::~string(local_b68);
    std::allocator<char>::~allocator((allocator<char> *)&local_b69);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_be8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_bf8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_be8,0x3a,&local_bf8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c30,"/A/B/Type",&local_c31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c58,"/A/B/",&local_c59);
    bVar2 = Typelib::isInNamespace(local_c30,local_c58,false);
    boost::test_tools::assertion_result::assertion_result(&local_c10,(bool)(bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c90,"isInNamespace(\"/A/B/Type\" , \"/A/B/\" , false)",0x2c);
    boost::unit_test::operator<<(&local_c80,plVar4,&local_c90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ca0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_c10,&local_c80,&local_ca0,0x3a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_c80);
    boost::test_tools::assertion_result::~assertion_result(&local_c10);
    std::__cxx11::string::~string(local_c58);
    std::allocator<char>::~allocator((allocator<char> *)&local_c59);
    std::__cxx11::string::~string(local_c30);
    std::allocator<char>::~allocator((allocator<char> *)&local_c31);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cb0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_cc0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_cb0,0x3b,&local_cc0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_cf8,"/A/B/C/Type",&local_cf9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d20,"/A/B",&local_d21);
    bVar2 = Typelib::isInNamespace(local_cf8,local_d20,true);
    boost::test_tools::assertion_result::assertion_result(&local_cd8,(bool)(bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d58,"isInNamespace(\"/A/B/C/Type\" , \"/A/B\" , true)",0x2c);
    boost::unit_test::operator<<(&local_d48,plVar4,&local_d58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d68,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_cd8,&local_d48,&local_d68,0x3b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_d48);
    boost::test_tools::assertion_result::~assertion_result(&local_cd8);
    std::__cxx11::string::~string(local_d20);
    std::allocator<char>::~allocator((allocator<char> *)&local_d21);
    std::__cxx11::string::~string(local_cf8);
    std::allocator<char>::~allocator((allocator<char> *)&local_cf9);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d78,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d88);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d78,0x3c,&local_d88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_dc0,"/A/B/C/Type",&local_dc1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_de8,"/A/B/",&local_de9);
    bVar2 = Typelib::isInNamespace(local_dc0,local_de8,true);
    boost::test_tools::assertion_result::assertion_result(&local_da0,(bool)(bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e20,"isInNamespace(\"/A/B/C/Type\" , \"/A/B/\" , true)",0x2d);
    boost::unit_test::operator<<(&local_e10,plVar4,&local_e20);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e30,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_da0,&local_e10,&local_e30,0x3c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_e10);
    boost::test_tools::assertion_result::~assertion_result(&local_da0);
    std::__cxx11::string::~string(local_de8);
    std::allocator<char>::~allocator((allocator<char> *)&local_de9);
    std::__cxx11::string::~string(local_dc0);
    std::allocator<char>::~allocator((allocator<char> *)&local_dc1);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e40,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e50);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e40,0x3d,&local_e50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e88,"/A/B/Type",&local_e89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_eb0,"/A/B",&local_eb1);
    bVar2 = Typelib::isInNamespace(local_e88,local_eb0,true);
    boost::test_tools::assertion_result::assertion_result(&local_e68,(bool)(bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ee8,"isInNamespace(\"/A/B/Type\" , \"/A/B\" , true)",0x2a);
    boost::unit_test::operator<<(&local_ed8,plVar4,&local_ee8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ef8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_e68,&local_ed8,&local_ef8,0x3d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_ed8);
    boost::test_tools::assertion_result::~assertion_result(&local_e68);
    std::__cxx11::string::~string(local_eb0);
    std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
    std::__cxx11::string::~string(local_e88);
    std::allocator<char>::~allocator((allocator<char> *)&local_e89);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f08,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f18);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f08,0x3e,&local_f18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f50,"/A/B/Type",&local_f51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f78,"/A/B/",&local_f79);
    bVar2 = Typelib::isInNamespace(local_f50,local_f78,true);
    boost::test_tools::assertion_result::assertion_result(&local_f30,(bool)(bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_fb0,"isInNamespace(\"/A/B/Type\" , \"/A/B/\" , true)",0x2b);
    boost::unit_test::operator<<(&local_fa0,plVar4,&local_fb0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_fc0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_f30,&local_fa0,&local_fc0,0x3e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_fa0);
    boost::test_tools::assertion_result::~assertion_result(&local_f30);
    std::__cxx11::string::~string(local_f78);
    std::allocator<char>::~allocator((allocator<char> *)&local_f79);
    std::__cxx11::string::~string(local_f50);
    std::allocator<char>::~allocator((allocator<char> *)&local_f51);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( test_typename_is_in_namespace )
{
    BOOST_CHECK(!isInNamespace("/A/B/Type" , "/A/C"    , false));
    BOOST_CHECK(!isInNamespace("/A/B/Type" , "/A/C/"   , false));
    BOOST_CHECK(!isInNamespace("/B/B/Type" , "/B/A"    , false));
    BOOST_CHECK(!isInNamespace("/B/B/Type" , "/B/A/"   , false));
    BOOST_CHECK(!isInNamespace("/A/B/Type" , "/A/B/C"  , false));
    BOOST_CHECK(!isInNamespace("/A/B/Type" , "/A/B/C/" , false));
    BOOST_CHECK(!isInNamespace("/A/B/Type" , "/A/C"    , true));
    BOOST_CHECK(!isInNamespace("/A/B/Type" , "/A/C/"   , true));
    BOOST_CHECK(!isInNamespace("/B/B/Type" , "/B/A"    , true));
    BOOST_CHECK(!isInNamespace("/B/B/Type" , "/B/A/"   , true));
    BOOST_CHECK(!isInNamespace("/A/B/Type" , "/A/B/C"  , true));
    BOOST_CHECK(!isInNamespace("/A/B/Type" , "/A/B/C/" , true));

    BOOST_CHECK(!isInNamespace("/A/B/C/Type" , "/A/B"  , false));
    BOOST_CHECK(!isInNamespace("/A/B/C/Type" , "/A/B/" , false));
    BOOST_CHECK( isInNamespace("/A/B/Type"   , "/A/B"  , false));
    BOOST_CHECK( isInNamespace("/A/B/Type"   , "/A/B/" , false));
    BOOST_CHECK( isInNamespace("/A/B/C/Type" , "/A/B"  , true));
    BOOST_CHECK( isInNamespace("/A/B/C/Type" , "/A/B/" , true));
    BOOST_CHECK( isInNamespace("/A/B/Type"   , "/A/B"  , true));
    BOOST_CHECK( isInNamespace("/A/B/Type"   , "/A/B/" , true));
}